

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topic_manager.cpp
# Opt level: O2

void __thiscall miniros::TopicManager::getBusInfo(TopicManager *this,XmlRpcValue *info)

{
  __shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _List_node_base *p_Var2;
  __shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  PublicationPtr t;
  __shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  XmlRpc::XmlRpcValue::assertArray(info,0);
  std::recursive_mutex::lock(&this->advertised_topics_mutex_);
  p_Var1 = &((this->advertised_topics_).
             super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var3 = &((this->advertised_topics_).
                  super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>;
      p_Var3 != p_Var1; p_Var3 = p_Var3 + 1) {
    std::__shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2> *)&local_40,p_Var3);
    Publication::getInfo((Publication *)local_40._M_ptr,info);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->advertised_topics_mutex_);
  std::mutex::lock(&this->subs_mutex_);
  p_Var2 = (_List_node_base *)&this->subscriptions_;
  while (p_Var2 = (((_List_base<std::shared_ptr<miniros::Subscription>,_std::allocator<std::shared_ptr<miniros::Subscription>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->subscriptions_) {
    std::__shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2> *)(p_Var2 + 1));
    Subscription::getInfo(local_40._M_ptr,info);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void TopicManager::getBusInfo(XmlRpcValue& info)
{
  // force these guys to be arrays, even if we don't populate them
  info.setSize(0);

  {
    std::scoped_lock<std::recursive_mutex> lock(advertised_topics_mutex_);
    for (PublicationPtr t: advertised_topics_) {
      t->getInfo(info);
    }
  }

  {
    std::scoped_lock<std::mutex> lock(subs_mutex_);
    for (SubscriptionPtr t: subscriptions_) {
      t->getInfo(info);
    }
  }
}